

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::refineNearby(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  vector<int,_std::allocator<int>_> *plain;
  pointer piVar1;
  pointer piVar2;
  THypothesis *pTVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int k;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  char local_185;
  uint local_184;
  TParameters *local_180;
  TResult *local_178;
  ulong local_170;
  THypothesis hcur;
  THypothesis hbest;
  THypothesis hnew;
  
  piVar1 = (result->clusters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (result->clusters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_header;
  hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hcur.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hcur.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hcur.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hbest.p = 0.0;
  local_180 = params;
  hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       hcur.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&hbest.clMap._M_t,&(result->clMap)._M_t);
  hbest.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hbest.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hbest.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hbest.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hbest.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  hbest.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hcur.p = hbest.p;
  local_178 = result;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&hcur.clMap._M_t,&hbest.clMap._M_t);
  plain = &hcur.plain;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(plain,&hbest.plain);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&hcur.memo,&hbest.memo);
  refineNearby::THypothesis::~THypothesis(&hbest);
  translate(&hcur.clMap,&result->clusters,plain);
  uVar14 = (ulong)((long)piVar1 - (long)piVar2) >> 2;
  piVar1 = (local_180->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(local_180->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  uVar10 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar10;
  }
  for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    iVar12 = piVar1[uVar10];
    if (iVar12 != -1) {
      hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = iVar12;
    }
  }
  iVar12 = (int)uVar14;
  hbest.p = 1.0;
  std::vector<float,_std::allocator<float>_>::resize(&hcur.memo,(long)iVar12,&hbest.p);
  hcur.p = calcScore(local_180,freqMap,plain,&hcur.memo);
  refineNearby::THypothesis::THypothesis(&hbest,&hcur);
  uVar6 = 0;
  if (0 < iVar12) {
    uVar6 = uVar14 & 0xffffffff;
  }
  local_170 = uVar6;
  do {
    pTVar3 = refineNearby::THypothesis::operator=(&hcur,&hbest);
    local_184 = (uint)CONCAT71((int7)((ulong)pTVar3 >> 8),1);
    iVar11 = 0;
    iVar13 = -1;
    for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      if (0xffffffe5 <
          hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] - 0x1bU) {
        refineNearby::THypothesis::THypothesis(&hnew,&hcur);
        lVar9 = 1;
        while( true ) {
          local_185 = (char)hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar5] + '`';
          pmVar4 = std::
                   map<char,_std::vector<char,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ::at(&kNearbyKeys,&local_185);
          if (*(int *)&(pmVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(pmVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start <= lVar9) break;
          local_185 = (char)hcur.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar5] + '`';
          pmVar4 = std::
                   map<char,_std::vector<char,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ::at(&kNearbyKeys,&local_185);
          hnew.plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] =
               (pmVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar9] + -0x60;
          lVar7 = (long)(iVar13 + freqMap->len);
          if (iVar12 + -1 <= lVar7) {
            lVar7 = (long)(iVar12 + -1);
          }
          lVar8 = (long)(iVar11 - freqMap->len);
          if (lVar8 < 0) {
            lVar8 = -1;
          }
          for (lVar8 = lVar8 << 2; lVar7 * 4 != lVar8; lVar8 = lVar8 + 4) {
            *(undefined4 *)
             ((long)hnew.memo.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar8 + 4) = 0x3f800000;
          }
          hnew.p = calcScore(local_180,freqMap,&hnew.plain,&hnew.memo);
          if (hbest.p < hnew.p) {
            refineNearby::THypothesis::operator=(&hbest,&hnew);
            local_184 = 0;
          }
          lVar9 = lVar9 + 1;
        }
        refineNearby::THypothesis::~THypothesis(&hnew);
        uVar6 = local_170;
      }
      iVar13 = iVar13 + 1;
      iVar11 = iVar11 + 1;
    }
  } while ((local_184 & 1) == 0);
  printPlain(&hbest.plain);
  printf(" [%8.3f %8.3f]",SUB84((double)hbest.p,0),(double)local_178->p);
  refineNearby::THypothesis::~THypothesis(&hbest);
  refineNearby::THypothesis::~THypothesis(&hcur);
  return true;
}

Assistant:

bool refineNearby(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {

        const int N = result.clusters.size();

        struct THypothesis {
            TProb p;
            TClusterToLetterMap clMap;
            std::vector<TLetter> plain;
            std::vector<TProb> memo;
        };

        {
            THypothesis hcur;
            hcur = { 0.0, result.clMap, {}, {}};
            translate(hcur.clMap, result.clusters, hcur.plain);
            for (int i = 0; i < (int) params.hint.size(); ++i) {
                if (params.hint[i] != -1) {
                    hcur.plain[i] = params.hint[i];
                }
            }
            hcur.memo.resize(N, 1.0);
            hcur.p = calcScore(params, freqMap, hcur.plain, hcur.memo);

            THypothesis hbest = hcur;
            while (true) {
                bool converged = true;

                hcur = hbest;
                for (int i = 0; i < N; ++i) {
                    if (hcur.plain[i] < 1 || hcur.plain[i] > 26) continue;
                    auto hnew = hcur;
                    for (int k = 1; k < (int) kNearbyKeys.at('a' + hcur.plain[i] - 1).size(); ++k) {
                        hnew.plain[i] = kNearbyKeys.at('a' + hcur.plain[i] - 1)[k] - 'a' + 1;
                        const auto idx0 = std::max(0, i - freqMap.len + 1);
                        const auto idx1 = std::min(N - 1, i + freqMap.len - 1);
                        std::fill(hnew.memo.begin() + idx0, hnew.memo.begin() + idx1 + 1, 1.0);
                        hnew.p = calcScore(params, freqMap, hnew.plain, hnew.memo);
                        if (hbest.p < hnew.p) {
                            hbest = hnew;
                            converged = false;
                        }
                    }
                }

                if (converged) break;
            }

            printPlain(hbest.plain);
            printf(" [%8.3f %8.3f]", (double) hbest.p, (double) result.p);
        }

        return true;
    }